

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError MuxDeleteAllNamedData(WebPMux *mux,uint32_t tag)

{
  WebPChunkId id_00;
  int iVar1;
  uint32_t in_ESI;
  WebPMux *in_RDI;
  WebPChunkId id;
  undefined4 local_4;
  
  id_00 = ChunkGetIdFromTag(in_ESI);
  iVar1 = IsWPI(id_00);
  if (iVar1 == 0) {
    MuxGetChunkListFromId(in_RDI,id_00);
    local_4 = DeleteChunks((WebPChunk **)in_RDI,in_ESI);
  }
  else {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  return local_4;
}

Assistant:

static WebPMuxError MuxDeleteAllNamedData(WebPMux* const mux, uint32_t tag) {
  const WebPChunkId id = ChunkGetIdFromTag(tag);
  assert(mux != NULL);
  if (IsWPI(id)) return WEBP_MUX_INVALID_ARGUMENT;
  return DeleteChunks(MuxGetChunkListFromId(mux, id), tag);
}